

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_type.cpp
# Opt level: O2

ScalarFunction * duckdb::VectorTypeFun::GetFunction(void)

{
  ScalarFunction *in_RDI;
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_b2;
  allocator local_b1;
  code *local_b0 [2];
  code *local_a0;
  code *local_98;
  LogicalType local_90 [24];
  LogicalType local_78 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_60;
  LogicalType local_48 [24];
  string local_30 [32];
  
  std::__cxx11::string::string(local_30,"vector_type",&local_b1);
  duckdb::LogicalType::LogicalType(local_78,ANY);
  __l._M_len = 1;
  __l._M_array = local_78;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_60,__l,&local_b2);
  duckdb::LogicalType::LogicalType(local_90,VARCHAR);
  local_b0[1] = (code *)0x0;
  local_b0[0] = VectorTypeFunction;
  local_98 = std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_invoke;
  local_a0 = std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_manager;
  duckdb::LogicalType::LogicalType(local_48,INVALID);
  duckdb::ScalarFunction::ScalarFunction();
  duckdb::LogicalType::~LogicalType(local_48);
  std::_Function_base::~_Function_base((_Function_base *)local_b0);
  duckdb::LogicalType::~LogicalType(local_90);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_60);
  duckdb::LogicalType::~LogicalType(local_78);
  std::__cxx11::string::~string(local_30);
  in_RDI->field_0xa9 = 1;
  return in_RDI;
}

Assistant:

ScalarFunction VectorTypeFun::GetFunction() {
	auto vector_type_fun = ScalarFunction("vector_type",        // name of the function
	                                      {LogicalType::ANY},   // argument list
	                                      LogicalType::VARCHAR, // return type
	                                      VectorTypeFunction);
	vector_type_fun.null_handling = FunctionNullHandling::SPECIAL_HANDLING;
	return vector_type_fun;
}